

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

LY_ERR lyd_dup_inst_next(lyd_node **inst,lyd_node *siblings,ly_ht **dup_inst_ht)

{
  ly_set **set;
  lysc_node *plVar1;
  LY_ERR LVar2;
  ly_ht *plVar3;
  ly_set *plVar4;
  uint uVar5;
  uint32_t uVar6;
  lys_module *plVar7;
  lyd_dup_inst *item;
  lyd_dup_inst **item_p;
  lyd_node *local_38;
  void *local_30;
  void **local_28;
  
  local_38 = *inst;
  if (local_38 == (lyd_node *)0x0) {
    return LY_SUCCESS;
  }
  if (*dup_inst_ht == (ly_ht *)0x0) {
    plVar3 = lyht_new(2,8,lyht_dup_inst_ht_equal_cb,(void *)0x0,1);
    *dup_inst_ht = plVar3;
    if (plVar3 == (ly_ht *)0x0) goto LAB_00126cfc;
LAB_00126cab:
    local_30 = calloc(1,0x10);
    if (local_30 == (void *)0x0) goto LAB_00126cfc;
    LVar2 = lyht_insert(*dup_inst_ht,&local_30,local_38->hash,(void **)0x0);
    local_28 = &local_30;
    if (LVar2 != LY_SUCCESS) goto LAB_00126cfc;
  }
  else {
    LVar2 = lyht_find(*dup_inst_ht,&local_38,local_38->hash,&local_28);
    if (LVar2 != LY_SUCCESS) goto LAB_00126cab;
  }
  set = (ly_set **)*local_28;
  if (set != (ly_set **)0x0) {
    uVar5 = *(uint *)(set + 1);
    if (uVar5 == 0) {
      lyd_find_sibling_dup_inst_set(siblings,*inst,set);
      plVar4 = *set;
      uVar6 = plVar4->count;
      if ((uVar6 == 0) || (*(plVar4->field_2).dnodes != *inst)) {
        __assert_fail("dup_inst->set->count && (dup_inst->set->dnodes[0] == *inst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                      ,0x7c,
                      "LY_ERR lyd_dup_inst_next(struct lyd_node **, const struct lyd_node *, struct ly_ht **)"
                     );
      }
      uVar5 = *(uint *)(set + 1);
    }
    else {
      plVar4 = *set;
      uVar6 = plVar4->count;
    }
    if (uVar5 != uVar6) {
      if (uVar5 < uVar6) {
        *inst = (plVar4->field_2).dnodes[uVar5];
        *(uint *)(set + 1) = uVar5 + 1;
        return LY_SUCCESS;
      }
      __assert_fail("dup_inst->used < dup_inst->set->count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                    ,0x85,
                    "LY_ERR lyd_dup_inst_next(struct lyd_node **, const struct lyd_node *, struct ly_ht **)"
                   );
    }
    plVar1 = (*inst)->schema;
    if (plVar1 == (lysc_node *)0x0) {
      return LY_SUCCESS;
    }
    if (plVar1->nodetype == 8) {
      if ((plVar1->flags & 1) != 0) {
        return LY_SUCCESS;
      }
    }
    else {
      if (plVar1->nodetype != 0x10) {
        return LY_SUCCESS;
      }
      if ((plVar1->flags & 0x200) == 0) {
        return LY_SUCCESS;
      }
    }
    *inst = (lyd_node *)0x0;
    return LY_SUCCESS;
  }
LAB_00126cfc:
  if (siblings->schema == (lysc_node *)0x0) {
    plVar7 = (lys_module *)&siblings[2].schema;
  }
  else {
    plVar7 = siblings->schema->module;
  }
  ly_log(plVar7->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_inst_next");
  return LY_EMEM;
}

Assistant:

LY_ERR
lyd_dup_inst_next(struct lyd_node **inst, const struct lyd_node *siblings, struct ly_ht **dup_inst_ht)
{
    struct lyd_dup_inst *dup_inst;

    if (!*inst) {
        /* no match, inst is unchanged */
        return LY_SUCCESS;
    }

    /* there can be more exact same instances (even if not allowed in invalid data) and we must make sure we do not
     * match a single node more times */
    dup_inst = lyd_dup_inst_get(*inst, dup_inst_ht);
    LY_CHECK_ERR_RET(!dup_inst, LOGMEM(LYD_CTX(siblings)), LY_EMEM);

    if (!dup_inst->used) {
        /* we did not cache these instances yet, do so */
        lyd_find_sibling_dup_inst_set(siblings, *inst, &dup_inst->set);
        assert(dup_inst->set->count && (dup_inst->set->dnodes[0] == *inst));
    }

    if (dup_inst->used == dup_inst->set->count) {
        if (lysc_is_dup_inst_list((*inst)->schema)) {
            /* we have used all the instances */
            *inst = NULL;
        } /* else just keep using the last (ideally only) instance */
    } else {
        assert(dup_inst->used < dup_inst->set->count);

        /* use another instance */
        *inst = dup_inst->set->dnodes[dup_inst->used];
        ++dup_inst->used;
    }

    return LY_SUCCESS;
}